

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swab.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_dd8::ByteSwap<double>::Run(ByteSwap<double> *this,istream *input_stream)

{
  int iVar1;
  ulong uVar2;
  fpos<__mbstate_t> *in_RSI;
  uchar *in_RDI;
  uchar *p;
  int offset;
  int address;
  double data;
  int c;
  int i;
  uchar tmp;
  int skip_size;
  int data_size;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  undefined1 uVar3;
  fpos<__mbstate_t> *in_stack_ffffffffffffff90;
  uint7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  bool bVar4;
  int local_50;
  int local_4c;
  undefined8 local_38;
  undefined8 local_30;
  int local_28;
  
  local_4c = *(int *)(in_RDI + 8) + *(int *)(in_RDI + 0xc) * 8;
  if (in_RSI == (fpos<__mbstate_t> *)&std::cin) {
    local_28 = 0;
    while( true ) {
      bVar4 = false;
      if (local_28 < local_4c) {
        bVar4 = sptk::ReadStream<unsigned_char>
                          ((uchar *)(ulong)in_stack_ffffffffffffff98,
                           (istream *)in_stack_ffffffffffffff90);
      }
      if (bVar4 == false) break;
      local_28 = local_28 + 1;
    }
    in_stack_ffffffffffffff9f = 0;
    in_RSI = in_stack_ffffffffffffff90;
  }
  else {
    std::fpos<__mbstate_t>::fpos
              (in_RSI,CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    std::istream::seekg(in_RSI,local_38,local_30);
  }
  iVar1 = std::istream::peek();
  if ((iVar1 != -1) && (uVar2 = std::ios::fail(), (uVar2 & 1) == 0)) {
    local_50 = *(int *)(in_RDI + 0xc);
    while( true ) {
      if (((*(int *)(in_RDI + 0x10) == -1) || (uVar3 = false, local_4c <= *(int *)(in_RDI + 0x10)))
         && ((*(int *)(in_RDI + 0x14) == -1 || (uVar3 = false, local_50 <= *(int *)(in_RDI + 0x14)))
            )) {
        uVar3 = sptk::ReadStream<double>
                          ((double *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                           (istream *)in_RSI);
      }
      if ((bool)uVar3 == false) break;
      std::reverse<unsigned_char*>
                (in_RDI,(uchar *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      bVar4 = sptk::WriteStream<double>
                        ((double)CONCAT17(uVar3,in_stack_ffffffffffffff88),(ostream *)0x107afe);
      if (!bVar4) {
        return false;
      }
      local_4c = local_4c + 8;
      local_50 = local_50 + 1;
    }
    return true;
  }
  return false;
}

Assistant:

bool Run(std::istream* input_stream) const override {
    // Skip data.
    const int data_size(static_cast<int>(sizeof(T)));
    const int skip_size(start_address_ + data_size * start_offset_);
    if (&std::cin == input_stream) {
      unsigned char tmp;
      int i(0);
      while (i < skip_size && sptk::ReadStream(&tmp, input_stream)) {
        ++i;
      }
    } else {
      input_stream->seekg(skip_size);
    }
    const int c(input_stream->peek());
    if (EOF == c || input_stream->fail()) {
      return false;
    }

    // Swap data.
    T data;
    for (int address(skip_size), offset(start_offset_);
         (kMagicNumberForEnd == end_address_ || address <= end_address_) &&
         (kMagicNumberForEnd == end_offset_ || offset <= end_offset_) &&
         sptk::ReadStream(&data, input_stream);
         address += data_size, ++offset) {
      unsigned char* p(reinterpret_cast<unsigned char*>(&data));
      std::reverse(p, p + data_size);
      if (!sptk::WriteStream(data, &std::cout)) {
        return false;
      }
    }

    return true;
  }